

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

int input_deinit(void)

{
  GSList *pGVar1;
  GSList *pGVar2;
  FILE *__stream;
  int iVar3;
  undefined8 uVar4;
  GSList **ppGVar5;
  GSList **ppGVar6;
  
  ppGVar5 = &plugin_ops;
  ppGVar6 = &g_modules;
  while ((pGVar1 = *ppGVar5, pGVar1 != (GSList *)0x0 && (pGVar2 = *ppGVar6, pGVar2 != (GSList *)0x0)
         )) {
    if ((pGVar1->data != (gpointer)0x0) && (pGVar2->data != (gpointer)0x0)) {
      (**(code **)((long)pGVar1->data + 0x68))();
      iVar3 = g_module_close(pGVar2->data);
      __stream = _stderr;
      if (iVar3 == 0) {
        uVar4 = g_module_error();
        fprintf(__stream,"%s\n",uVar4);
      }
    }
    ppGVar5 = &pGVar1->next;
    ppGVar6 = &pGVar2->next;
  }
  g_slist_free(g_modules);
  g_slist_free(plugin_ops);
  g_slist_free(plugin_exts);
  return 0;
}

Assistant:

int
input_deinit(void)
{
	/* unload plugins */
	GSList *ops = plugin_ops;
	GSList *modules = g_modules;

	while (ops && modules) {
		if (ops->data && modules->data) {
			((struct input_ops *)ops->data)->exit_library();
			if (!g_module_close((GModule *)modules->data)) {
				fprintf(stderr, "%s\n", g_module_error());
			}
		}
		ops = g_slist_next(ops);
		modules = g_slist_next(modules);
	}
	g_slist_free(g_modules);
	g_slist_free(plugin_ops);
	g_slist_free(plugin_exts);
	return 0;
}